

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_str_runes(nk_str *str,int pos,nk_rune *runes)

{
  int len;
  char local_30 [4];
  int byte_len;
  nk_glyph glyph;
  int i;
  nk_rune *runes_local;
  int pos_local;
  nk_str *str_local;
  
  byte_len = 0;
  _glyph = runes;
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x213e,"int nk_str_insert_str_runes(struct nk_str *, int, const nk_rune *)");
  }
  if ((str == (nk_str *)0x0) || (runes == (nk_rune *)0x0)) {
    str_local._4_4_ = 0;
  }
  else {
    for (; _glyph[byte_len] != 0; byte_len = byte_len + 1) {
      len = nk_utf_encode(_glyph[byte_len],local_30,4);
      nk_str_insert_at_rune(str,pos + byte_len,local_30,len);
    }
    str_local._4_4_ = byte_len;
  }
  return str_local._4_4_;
}

Assistant:

NK_API int
nk_str_insert_str_runes(struct nk_str *str, int pos, const nk_rune *runes)
{
    int i = 0;
    nk_glyph glyph;
    int byte_len;
    NK_ASSERT(str);
    if (!str || !runes) return 0;
    while (runes[i] != '\0') {
        byte_len = nk_utf_encode(runes[i], glyph, NK_UTF_SIZE);
        nk_str_insert_at_rune(str, pos+i, glyph, byte_len);
        i++;
    }
    return i;
}